

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O1

void __thiscall
QPDFAcroFormDocumentHelper::fixCopiedAnnotations
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *to_page,QPDFObjectHandle *from_page,
          QPDFAcroFormDocumentHelper *from_afdh,
          set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *added_fields)

{
  _Base_ptr *pp_Var1;
  pointer pQVar2;
  bool bVar3;
  int iVar4;
  QPDFObjectHandle *f;
  pointer this_00;
  QPDFObjectHandle old_annots;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_fields;
  QPDFObjectHandle local_e8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_annots;
  QPDFObjectHandle local_b8;
  undefined1 local_a8 [48];
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> old_fields;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_48;
  
  pp_Var1 = &old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  old_fields._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&old_fields,"/Annots","");
  QPDFObjectHandle::getKey(&old_annots,(string *)from_page);
  if ((_Base_ptr *)old_fields._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)old_fields._M_t._M_impl._0_8_,
                    (ulong)((long)&(old_fields._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  bVar3 = QPDFObjectHandle::isArray(&old_annots);
  if (bVar3) {
    iVar4 = QPDFObjectHandle::getArrayNItems(&old_annots);
    if (iVar4 != 0) {
      new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &old_fields._M_t._M_impl.super__Rb_tree_header._M_header;
      old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = old_annots.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           old_annots.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (old_annots.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (old_annots.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (old_annots.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (old_annots.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (old_annots.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           old_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_a8);
      transformAnnotations
                (this,&local_e8,&new_annots,&new_fields,&old_fields,(QPDFMatrix *)local_a8,
                 (from_afdh->super_QPDFDocumentHelper).qpdf,from_afdh);
      if (local_e8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      local_a8._0_8_ = (long)local_a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"/Annots","");
      QPDFObjectHandle::newArray(&local_b8,&new_annots);
      QPDFObjectHandle::replaceKey(to_page,(string *)local_a8,&local_b8);
      if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_a8._0_8_ != (long)local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
                (&local_48,&new_fields);
      addAndRenameFormFields(this,&local_48);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_48);
      pQVar2 = new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (added_fields != (set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)0x0
         ) {
        if (new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          this_00 = new_fields.
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            local_a8._0_8_ = QPDFObjectHandle::getObjGen(this_00);
            std::
            _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
            ::_M_insert_unique<QPDFObjGen>(&added_fields->_M_t,(QPDFObjGen *)local_a8);
            this_00 = this_00 + 1;
          } while (this_00 != pQVar2);
        }
      }
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree(&old_fields._M_t);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&new_fields);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&new_annots);
    }
  }
  if (old_annots.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (old_annots.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::fixCopiedAnnotations(
    QPDFObjectHandle to_page,
    QPDFObjectHandle from_page,
    QPDFAcroFormDocumentHelper& from_afdh,
    std::set<QPDFObjGen>* added_fields)
{
    auto old_annots = from_page.getKey("/Annots");
    if ((!old_annots.isArray()) || (old_annots.getArrayNItems() == 0)) {
        return;
    }

    std::vector<QPDFObjectHandle> new_annots;
    std::vector<QPDFObjectHandle> new_fields;
    std::set<QPDFObjGen> old_fields;
    transformAnnotations(
        old_annots,
        new_annots,
        new_fields,
        old_fields,
        QPDFMatrix(),
        &(from_afdh.getQPDF()),
        &from_afdh);

    to_page.replaceKey("/Annots", QPDFObjectHandle::newArray(new_annots));
    addAndRenameFormFields(new_fields);
    if (added_fields) {
        for (auto const& f: new_fields) {
            added_fields->insert(f.getObjGen());
        }
    }
}